

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::internal::MatcherBase<const_pb::EnumFeature_&>::~MatcherBase
          (MatcherBase<const_pb::EnumFeature_&> *this)

{
  MatcherBase<const_pb::EnumFeature_&> *this_local;
  
  ~MatcherBase(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }